

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::DuckCatalog::BindCreateIndex
          (DuckCatalog *this,Binder *binder,CreateStatement *stmt,TableCatalogEntry *table,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *plan)

{
  _func_int **pp_Var1;
  unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
  *create_index_info;
  undefined8 *in_R9;
  IndexBinder index_binder;
  long *local_b0;
  undefined1 local_a8 [8];
  
  pp_Var1 = (_func_int **)
            (table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment.value_.
            hugeint.upper;
  (table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment.value_.hugeint.upper
       = 0;
  IndexBinder::IndexBinder
            ((IndexBinder *)&stack0xffffffffffffff60,(Binder *)stmt,
             (ClientContext *)(stmt->super_SQLStatement).stmt_location,
             (optional_ptr<duckdb::TableCatalogEntry,_true>)0x0,
             (optional_ptr<duckdb::CreateIndexInfo,_true>)0x0);
  create_index_info =
       (unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true> *)
       (stmt->super_SQLStatement).stmt_location;
  local_b0 = (long *)*in_R9;
  *in_R9 = 0;
  local_a8 = (undefined1  [8])pp_Var1;
  IndexBinder::BindCreateIndex
            ((IndexBinder *)this,(ClientContext *)&stack0xffffffffffffff60,create_index_info,
             (TableCatalogEntry *)local_a8,plan,
             (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>)
             &local_b0);
  if (local_b0 != (long *)0x0) {
    (**(code **)(*local_b0 + 8))();
  }
  local_b0 = (long *)0x0;
  if (local_a8 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_a8 + 8))();
  }
  local_a8 = (undefined1  [8])0x0;
  ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&stack0xffffffffffffff60);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> DuckCatalog::BindCreateIndex(Binder &binder, CreateStatement &stmt,
                                                         TableCatalogEntry &table, unique_ptr<LogicalOperator> plan) {
	D_ASSERT(plan->type == LogicalOperatorType::LOGICAL_GET);
	auto create_index_info = unique_ptr_cast<CreateInfo, CreateIndexInfo>(std::move(stmt.info));
	IndexBinder index_binder(binder, binder.context);
	return index_binder.BindCreateIndex(binder.context, std::move(create_index_info), table, std::move(plan), nullptr);
}